

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O0

void updateRoutingTableForNeighbor(routerip_t *neighbor,routingtable_t *neighborRouter)

{
  type *__lhs;
  bool bVar1;
  __type _Var2;
  int iVar3;
  int iVar4;
  mapped_type *pmVar5;
  bool local_11d;
  int local_114;
  __type local_f1;
  string local_d0;
  int local_b0;
  byte local_a9;
  cost_t cost_via_neighbor;
  reference local_88;
  Link *link;
  iterator __end2;
  iterator __begin2;
  vector<Link,_std::allocator<Link>_> *__range2;
  type *local_48;
  type *destEntry;
  type *destination;
  _Self local_30;
  iterator __end1;
  iterator __begin1;
  routingtable_t *__range1;
  routingtable_t *neighborRouter_local;
  routerip_t *neighbor_local;
  
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
           ::begin(&routingMap_abi_cxx11_);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
       ::end(&routingMap_abi_cxx11_);
  do {
    bVar1 = std::operator!=(&__end1,&local_30);
    if (!bVar1) {
      printUpdate();
      return;
    }
    destination = &std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>
                   ::operator*(&__end1)->first;
    destEntry = (type *)std::get<0ul,std::__cxx11::string_const,RoutingTableEntry>
                                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>
                                    *)destination);
    local_48 = std::get<1ul,std::__cxx11::string_const,RoutingTableEntry>
                         ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>
                           *)destination);
    __lhs = destEntry;
    Socket::getLocalIP_abi_cxx11_((string *)&__range2,&socketLocal);
    _Var2 = std::operator==(&__lhs->destination,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &__range2);
    std::__cxx11::string::~string((string *)&__range2);
    if (!_Var2) {
      __end2 = std::vector<Link,_std::allocator<Link>_>::begin(&links);
      link = (Link *)std::vector<Link,_std::allocator<Link>_>::end(&links);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>
                                         *)&link), bVar1) {
        local_88 = __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::
                   operator*(&__end2);
        _Var2 = std::operator==(neighbor,&local_88->neighbor);
        if (_Var2) {
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
                   ::operator[](&routingMap_abi_cxx11_,&destEntry->destination);
          _Var2 = std::operator==(neighbor,&pmVar5->nextHop);
          local_a9 = 0;
          local_f1 = false;
          if (_Var2) {
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
                     ::operator[](neighborRouter,&destEntry->destination);
            Socket::getLocalIP_abi_cxx11_((string *)&cost_via_neighbor,&socketLocal);
            local_a9 = 1;
            local_f1 = std::operator==(&pmVar5->nextHop,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&cost_via_neighbor);
          }
          if ((local_a9 & 1) != 0) {
            std::__cxx11::string::~string((string *)&cost_via_neighbor);
          }
          if (local_f1 != false) {
            std::__cxx11::string::operator=((string *)&local_48->nextHop,"-\t");
            iVar4 = std::numeric_limits<int>::max();
            local_48->cost = iVar4;
            break;
          }
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
                   ::operator[](neighborRouter,&destEntry->destination);
          iVar4 = pmVar5->cost;
          iVar3 = std::numeric_limits<int>::max();
          if (iVar4 == iVar3) {
            local_114 = std::numeric_limits<int>::max();
          }
          else {
            local_114 = local_88->cost;
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
                     ::operator[](neighborRouter,&destEntry->destination);
            local_114 = local_114 + pmVar5->cost;
          }
          local_b0 = local_114;
          _Var2 = std::operator==(neighbor,&local_48->nextHop);
          iVar4 = local_b0;
          if ((_Var2) && (local_48->cost != local_b0)) {
            local_48->cost = local_b0;
            iVar3 = std::numeric_limits<int>::max();
            if (iVar4 == iVar3) {
              std::__cxx11::string::operator=((string *)&local_48->nextHop,"-\t");
              iVar4 = std::numeric_limits<int>::max();
              local_48->cost = iVar4;
            }
            tableUpdated = true;
            break;
          }
          local_11d = false;
          if (local_b0 < local_48->cost) {
            Socket::getLocalIP_abi_cxx11_(&local_d0,&socketLocal);
            pmVar5 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
                     ::operator[](neighborRouter,&destEntry->destination);
            local_11d = std::operator!=(&local_d0,&pmVar5->nextHop);
            std::__cxx11::string::~string((string *)&local_d0);
          }
          if (local_11d != false) {
            std::__cxx11::string::operator=((string *)&local_48->nextHop,(string *)neighbor);
            local_48->cost = local_b0;
            tableUpdated = true;
            break;
          }
        }
        __gnu_cxx::__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_>::operator++
                  (&__end2);
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void updateRoutingTableForNeighbor(const routerip_t &neighbor, routingtable_t &neighborRouter) {
	for (auto &[destination, destEntry]:routingMap) {
		if (destination == socketLocal.getLocalIP()) continue;
		for (const auto &link:links) {
			if (neighbor == link.neighbor) {

				if(neighbor == routingMap[destination].nextHop && neighborRouter[destination].nextHop == socketLocal.getLocalIP()){
					// circular
					destEntry.nextHop = NONE;
					destEntry.cost = INF;
					break;
				}

				cost_t cost_via_neighbor =
						neighborRouter[destination].cost == INF ? INF : (link.cost + neighborRouter[destination].cost);
				if (neighbor == destEntry.nextHop && destEntry.cost != cost_via_neighbor) {
					// cost changed @ nextHop & neighbor is the way to reach into destination
					destEntry.cost = cost_via_neighbor;
					// || socketLocal.getLocalIP() == neighborRouter[destination].nextHop
					if (cost_via_neighbor == INF) {
						// 2nd condtn prevents circular updates for initial deactivated links
						destEntry.nextHop = NONE;
						destEntry.cost = INF;
					}
					tableUpdated = true;
					break;
				} else if (cost_via_neighbor < destEntry.cost &&
				           socketLocal.getLocalIP() != neighborRouter[destination].nextHop) {
					// take less cost not creating loop
					destEntry.nextHop = neighbor;
					destEntry.cost = cost_via_neighbor;
					tableUpdated = true;
					break;
				}
			}
		}
	}
	printUpdate();
}